

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_glnodes.cpp
# Opt level: O3

int CheckForMissingSegs(void)

{
  size_t __n;
  double *pdVar1;
  double *pdVar2;
  int iVar3;
  void *__s;
  long lVar4;
  int iVar5;
  ulong uVar6;
  seg_t *psVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  
  iVar9 = numsides;
  __n = (long)numsides * 8;
  uVar6 = 0xffffffffffffffff;
  if (-1 < (long)numsides) {
    uVar6 = __n;
  }
  __s = operator_new__(uVar6);
  iVar5 = 0;
  memset(__s,0,__n);
  if (0 < numsegs) {
    lVar8 = 0x10;
    lVar10 = 0;
    psVar7 = segs;
    iVar3 = numsegs;
    do {
      if (*(long *)((long)&psVar7->v1 + lVar8) != 0) {
        pdVar1 = *(double **)((long)psVar7 + lVar8 + -0x10);
        pdVar2 = *(double **)((long)psVar7 + lVar8 + -8);
        dVar11 = *pdVar2 - *pdVar1;
        dVar12 = pdVar2[1] - pdVar1[1];
        dVar11 = c_sqrt(dVar12 * dVar12 + dVar11 * dVar11);
        lVar4 = (*(long *)((long)&psVar7->v1 + lVar8) - (long)sides >> 3) * -0x5555555555555555;
        *(double *)((long)__s + lVar4) = dVar11 + *(double *)((long)__s + lVar4);
        psVar7 = segs;
        iVar3 = numsegs;
      }
      lVar10 = lVar10 + 1;
      lVar8 = lVar8 + 0x30;
      iVar9 = numsides;
    } while (lVar10 < iVar3);
  }
  if (0 < iVar9) {
    lVar8 = 0;
    lVar10 = 0x14;
    iVar5 = 0;
    do {
      lVar4 = *(long *)((long)sides->textures + lVar10 * 8 + -0x10);
      dVar11 = *(double *)(lVar4 + 0x10);
      dVar12 = *(double *)(lVar4 + 0x18);
      dVar11 = c_sqrt(dVar12 * dVar12 + dVar11 * dVar11);
      pdVar1 = (double *)((long)__s + lVar8 * 8);
      iVar5 = iVar5 + (uint)(*pdVar1 <= dVar11 + -1.0 && dVar11 + -1.0 != *pdVar1);
      lVar8 = lVar8 + 1;
      lVar10 = lVar10 + 0x18;
    } while (lVar8 < numsides);
  }
  operator_delete__(__s);
  return iVar5;
}

Assistant:

static int CheckForMissingSegs()
{
	double *added_seglen = new double[numsides];
	int missing = 0;

	memset(added_seglen, 0, sizeof(double)*numsides);
	for(int i=0;i<numsegs;i++)
	{
		seg_t * seg = &segs[i];

		if (seg->sidedef!=NULL)
		{
			// check all the segs and calculate the length they occupy on their sidedef
			DVector2 vec1(seg->v2->fX() - seg->v1->fX(), seg->v2->fY() - seg->v1->fY());
			added_seglen[seg->sidedef - sides] += vec1.Length();
		}
	}

	for(int i=0;i<numsides;i++)
	{
		double linelen = sides[i].linedef->Delta().Length();
		missing += (added_seglen[i] < linelen - 1.);
	}

	delete [] added_seglen;
	return missing;
}